

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitSIMDReplace
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,SIMDReplace *curr
          )

{
  Literal *pLVar1;
  Literal local_178;
  Literal local_160;
  Literal local_148;
  Literal local_130;
  Literal local_118;
  Literal local_100;
  Literal local_e8;
  undefined1 local_d0 [8];
  Flow flow;
  Literal value;
  undefined1 local_40 [8];
  Literal vec;
  
  visit((Flow *)local_d0,this,curr->vec);
  if (flow.breakTo.super_IString.str._M_len == 0) {
    pLVar1 = Flow::getSingleValue((Flow *)local_d0);
    Literal::Literal((Literal *)local_40,pLVar1);
    visit((Flow *)&flow.breakTo.super_IString.str._M_str,this,curr->value);
    Flow::operator=((Flow *)local_d0,(Flow *)&flow.breakTo.super_IString.str._M_str);
    SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)&flow.breakTo.super_IString.str._M_str);
    if (flow.breakTo.super_IString.str._M_len == 0) {
      pLVar1 = Flow::getSingleValue((Flow *)local_d0);
      Literal::Literal((Literal *)&flow.breakTo.super_IString.str._M_str,pLVar1);
      switch(curr->op) {
      case ReplaceLaneVecI8x16:
        pLVar1 = &local_178;
        Literal::replaceLaneI8x16
                  (pLVar1,(Literal *)local_40,(Literal *)&flow.breakTo.super_IString.str._M_str,
                   curr->index);
        Flow::Flow(__return_storage_ptr__,pLVar1);
        break;
      case ReplaceLaneVecI16x8:
        pLVar1 = &local_160;
        Literal::replaceLaneI16x8
                  (pLVar1,(Literal *)local_40,(Literal *)&flow.breakTo.super_IString.str._M_str,
                   curr->index);
        Flow::Flow(__return_storage_ptr__,pLVar1);
        break;
      case ReplaceLaneVecI32x4:
        pLVar1 = &local_148;
        Literal::replaceLaneI32x4
                  (pLVar1,(Literal *)local_40,(Literal *)&flow.breakTo.super_IString.str._M_str,
                   curr->index);
        Flow::Flow(__return_storage_ptr__,pLVar1);
        break;
      case ReplaceLaneVecI64x2:
        pLVar1 = &local_130;
        Literal::replaceLaneI64x2
                  (pLVar1,(Literal *)local_40,(Literal *)&flow.breakTo.super_IString.str._M_str,
                   curr->index);
        Flow::Flow(__return_storage_ptr__,pLVar1);
        break;
      case ReplaceLaneVecF16x8:
        pLVar1 = &local_118;
        Literal::replaceLaneF16x8
                  (pLVar1,(Literal *)local_40,(Literal *)&flow.breakTo.super_IString.str._M_str,
                   curr->index);
        Flow::Flow(__return_storage_ptr__,pLVar1);
        break;
      case ReplaceLaneVecF32x4:
        pLVar1 = &local_100;
        Literal::replaceLaneF32x4
                  (pLVar1,(Literal *)local_40,(Literal *)&flow.breakTo.super_IString.str._M_str,
                   curr->index);
        Flow::Flow(__return_storage_ptr__,pLVar1);
        break;
      case ReplaceLaneVecF64x2:
        pLVar1 = &local_e8;
        Literal::replaceLaneF64x2
                  (pLVar1,(Literal *)local_40,(Literal *)&flow.breakTo.super_IString.str._M_str,
                   curr->index);
        Flow::Flow(__return_storage_ptr__,pLVar1);
        break;
      default:
        handle_unreachable("invalid op",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                           ,0x4d6);
      }
      Literal::~Literal(pLVar1);
      Literal::~Literal((Literal *)&flow.breakTo.super_IString.str._M_str);
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)local_d0);
    }
    Literal::~Literal((Literal *)local_40);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_d0);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_d0);
  return __return_storage_ptr__;
}

Assistant:

Flow visitSIMDReplace(SIMDReplace* curr) {
    NOTE_ENTER("SIMDReplace");
    Flow flow = self()->visit(curr->vec);
    if (flow.breaking()) {
      return flow;
    }
    Literal vec = flow.getSingleValue();
    flow = self()->visit(curr->value);
    if (flow.breaking()) {
      return flow;
    }
    Literal value = flow.getSingleValue();
    switch (curr->op) {
      case ReplaceLaneVecI8x16:
        return vec.replaceLaneI8x16(value, curr->index);
      case ReplaceLaneVecI16x8:
        return vec.replaceLaneI16x8(value, curr->index);
      case ReplaceLaneVecI32x4:
        return vec.replaceLaneI32x4(value, curr->index);
      case ReplaceLaneVecI64x2:
        return vec.replaceLaneI64x2(value, curr->index);
      case ReplaceLaneVecF16x8:
        return vec.replaceLaneF16x8(value, curr->index);
      case ReplaceLaneVecF32x4:
        return vec.replaceLaneF32x4(value, curr->index);
      case ReplaceLaneVecF64x2:
        return vec.replaceLaneF64x2(value, curr->index);
    }
    WASM_UNREACHABLE("invalid op");
  }